

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O2

void __thiscall
FIX::ThreadedSocketAcceptor::onInitialize(ThreadedSocketAcceptor *this,SessionSettings *s)

{
  bool bVar1;
  int iVar2;
  int optval;
  Dictionary *this_00;
  _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
  *this_01;
  iterator iVar3;
  undefined7 extraout_var;
  mapped_type_conflict *pmVar4;
  char *__rhs;
  int port;
  undefined1 auVar5 [12];
  bool local_1b5;
  socket_handle socket;
  undefined4 local_1b0;
  int local_1ac;
  string local_1a8;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_188;
  SocketToPort *local_180;
  PortToSessions *local_178;
  SessionSettings *local_170;
  _Rb_tree_node_base *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  SocketException e;
  set<int,_std::less<int>,_std::allocator<int>_> ports;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ports._M_t._M_impl.super__Rb_tree_header._M_header;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ports._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_170 = s;
  ports._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ports._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  SessionSettings::getSessions(&sessions,s);
  local_178 = &this->m_portToSessions;
  local_180 = &this->m_socketToPort;
  local_188 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
              &this->m_sockets;
  do {
    if ((_Rb_tree_header *)sessions._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
        &sessions._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::~_Rb_tree(&sessions._M_t);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&ports._M_t);
      return;
    }
    local_168 = sessions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    this_00 = SessionSettings::get
                        (local_170,
                         (SessionID *)
                         (sessions._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"SocketAcceptPort",(allocator<char> *)&local_1a8);
    iVar2 = Dictionary::getInt(this_00,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    port = (int)(short)iVar2;
    e.super_Exception._0_4_ = port;
    this_01 = (_Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
               *)std::
                 map<int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
                 ::operator[](local_178,(key_type *)&e);
    std::
    _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
    ::_M_insert_unique<FIX::SessionID_const&>
              (this_01,(SessionID *)
                       (sessions._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
    e.super_Exception._0_4_ = port;
    iVar3 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&ports._M_t,(key_type *)&e);
    if ((_Rb_tree_header *)iVar3._M_node == &ports._M_t._M_impl.super__Rb_tree_header) {
      e.super_Exception._0_4_ = port;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&ports._M_t,(int *)&e);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"SocketReuseAddress",(allocator<char> *)&local_140);
      bVar1 = Dictionary::has(this_00,(string *)&e);
      local_1b5 = true;
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,"SocketReuseAddress",(allocator<char> *)&local_160);
        local_1b5 = Dictionary::getBool(this_00,&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"SocketNodelay",(allocator<char> *)&local_140);
      bVar1 = Dictionary::has(this_00,(string *)&e);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,"SocketNodelay",(allocator<char> *)&local_160);
        bVar1 = Dictionary::getBool(this_00,&local_1a8);
        local_1b0 = (undefined4)CONCAT71(extraout_var,bVar1);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      else {
        local_1b0 = 0;
      }
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"SocketSendBufferSize",(allocator<char> *)&local_140);
      bVar1 = Dictionary::has(this_00,(string *)&e);
      optval = 0;
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,"SocketSendBufferSize",(allocator<char> *)&local_160);
        optval = Dictionary::getInt(this_00,&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      local_1ac = iVar2;
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"SocketReceiveBufferSize",(allocator<char> *)&local_140);
      bVar1 = Dictionary::has(this_00,(string *)&e);
      iVar2 = 0;
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,"SocketReceiveBufferSize",(allocator<char> *)&local_160);
        iVar2 = Dictionary::getInt(this_00,&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      std::__cxx11::string::~string((string *)&e);
      socket = socket_createAcceptor(port,local_1b5);
      if (socket == -1) {
        SocketException::SocketException(&e);
        socket_close(socket);
        auVar5 = __cxa_allocate_exception(0x50);
        IntConvertor::convert_abi_cxx11_
                  (&local_70,(IntConvertor *)(ulong)(ushort)local_1ac,auVar5._8_4_);
        std::operator+(&local_50,"Unable to create, bind, or listen to port ",&local_70);
        std::operator+(&local_160,&local_50," (");
        __rhs = (char *)std::logic_error::what();
        std::operator+(&local_140,&local_160,__rhs);
        std::operator+(&local_1a8,&local_140,")");
        RuntimeError::RuntimeError(auVar5._0_8_,&local_1a8);
        __cxa_throw(auVar5._0_8_,&RuntimeError::typeinfo,Exception::~Exception);
      }
      if ((char)local_1b0 != '\0') {
        socket_setsockopt(socket,1);
      }
      if (optval != 0) {
        socket_setsockopt(socket,7,optval);
      }
      if (iVar2 != 0) {
        socket_setsockopt(socket,8,iVar2);
      }
      pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](local_180,&socket);
      *pmVar4 = port;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(local_188,&socket);
    }
    sessions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)std::_Rb_tree_increment(local_168);
  } while( true );
}

Assistant:

void ThreadedSocketAcceptor::onInitialize( const SessionSettings& s )
EXCEPT ( RuntimeError )
{
  short port = 0;
  std::set<int> ports;

  std::set<SessionID> sessions = s.getSessions();
  std::set<SessionID>::iterator i = sessions.begin();
  for( ; i != sessions.end(); ++i )
  {
    const Dictionary& settings = s.get( *i );
    port = (short)settings.getInt( SOCKET_ACCEPT_PORT );

    m_portToSessions[port].insert( *i );

    if( ports.find(port) != ports.end() )
      continue;
    ports.insert( port );

    const bool reuseAddress = settings.has( SOCKET_REUSE_ADDRESS ) ? 
      settings.getBool( SOCKET_REUSE_ADDRESS ) : true;

    const bool noDelay = settings.has( SOCKET_NODELAY ) ? 
      settings.getBool( SOCKET_NODELAY ) : false;

    const int sendBufSize = settings.has( SOCKET_SEND_BUFFER_SIZE ) ?
      settings.getInt( SOCKET_SEND_BUFFER_SIZE ) : 0;

    const int rcvBufSize = settings.has( SOCKET_RECEIVE_BUFFER_SIZE ) ?
      settings.getInt( SOCKET_RECEIVE_BUFFER_SIZE ) : 0;

    socket_handle socket = socket_createAcceptor( port, reuseAddress );
    if( socket == INVALID_SOCKET_HANDLE )
    {
      SocketException e;
      socket_close( socket );
      throw RuntimeError( "Unable to create, bind, or listen to port " 
                         + IntConvertor::convert( (unsigned short)port ) + " (" + e.what() + ")" );
    }
    if( noDelay )
      socket_setsockopt( socket, TCP_NODELAY );
    if( sendBufSize )
      socket_setsockopt( socket, SO_SNDBUF, sendBufSize );
    if( rcvBufSize )
      socket_setsockopt( socket, SO_RCVBUF, rcvBufSize );

    m_socketToPort[socket] = port;
    m_sockets.insert( socket );
  }    
}